

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestString.cpp
# Opt level: O0

void testBase64(void)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  String local_1a8;
  String local_180;
  String local_158;
  String local_130;
  String local_108;
  String local_e0;
  String local_b8;
  String local_90;
  String local_58;
  String local_30;
  
  String::String<17ul>(&local_58,(char (*) [17])"bGlnaHQgd29yay4=");
  String::fromBase64(&local_30,&local_58);
  bVar2 = String::operator==(&local_30,(char (*) [12])"light work.");
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                          ,0xb9,"String::fromBase64(\"bGlnaHQgd29yay4=\") == \"light work.\"");
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  String::~String(&local_30);
  String::~String(&local_58);
  String::String<17ul>(&local_b8,(char (*) [17])"bGlnaHQgd29yaw==");
  String::fromBase64(&local_90,&local_b8);
  bVar2 = String::operator==(&local_90,(char (*) [11])"light work");
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                          ,0xba,"String::fromBase64(\"bGlnaHQgd29yaw==\") == \"light work\"");
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  String::~String(&local_90);
  String::~String(&local_b8);
  String::String<13ul>(&local_108,(char (*) [13])"bGlnaHQgd29y");
  String::fromBase64(&local_e0,&local_108);
  bVar2 = String::operator==(&local_e0,(char (*) [10])"light wor");
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                          ,0xbb,"String::fromBase64(\"bGlnaHQgd29y\") == \"light wor\"");
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  String::~String(&local_e0);
  String::~String(&local_108);
  String::String<13ul>(&local_158,(char (*) [13])"bGlnaHQgd28=");
  String::fromBase64(&local_130,&local_158);
  bVar2 = String::operator==(&local_130,(char (*) [9])"light wo");
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                          ,0xbc,"String::fromBase64(\"bGlnaHQgd28=\") == \"light wo\"");
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  String::~String(&local_130);
  String::~String(&local_158);
  String::String<13ul>(&local_1a8,(char (*) [13])"bGlnaHQgdw==");
  String::fromBase64(&local_180,&local_1a8);
  bVar2 = String::operator==(&local_180,(char (*) [8])"light w");
  if (!bVar2) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestString.cpp"
                          ,0xbd,"String::fromBase64(\"bGlnaHQgdw==\") == \"light w\"");
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  String::~String(&local_180);
  String::~String(&local_1a8);
  return;
}

Assistant:

void testBase64()
{
    ASSERT(String::fromBase64("bGlnaHQgd29yay4=") == "light work.");
    ASSERT(String::fromBase64("bGlnaHQgd29yaw==") == "light work");
    ASSERT(String::fromBase64("bGlnaHQgd29y") == "light wor");
    ASSERT(String::fromBase64("bGlnaHQgd28=") == "light wo");
    ASSERT(String::fromBase64("bGlnaHQgdw==") == "light w");
}